

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O3

char * next_log_token(void)

{
  char *pcVar1;
  undefined8 in_RAX;
  long lVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  char c;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  lVar2 = ftell((FILE *)loginfo.flog);
  iVar3 = 0;
  loginfo.last_token_start = lVar2;
  while( true ) {
    if (next_log_token::rbuflen <= iVar3) {
      sVar4 = (size_t)(uint)(next_log_token::rbuflen * 2);
      if (next_log_token::rbuflen * 2 < 0x101) {
        sVar4 = 0x100;
      }
      next_log_token::rbuflen = (int)sVar4;
      next_log_token::rbuf = (char *)realloc(next_log_token::rbuf,sVar4);
    }
    pcVar1 = next_log_token::rbuf;
    lVar5 = (long)iVar3;
    if (loginfo.endpos <= (ulong)(lVar2 + lVar5)) break;
    sVar4 = fread((void *)((long)&uStack_38 + 7),1,1,(FILE *)loginfo.flog);
    pcVar1 = next_log_token::rbuf;
    if (sVar4 != 1) {
      raw_printf("Unexpected EOF or error in save file");
      terminate();
    }
    next_log_token::rbuf[lVar5] = uStack_38._7_1_;
    if (((ulong)uStack_38._7_1_ < 0x21) &&
       ((0x100002400U >> ((ulong)uStack_38._7_1_ & 0x3f) & 1) != 0)) {
      bVar6 = iVar3 != 0;
      iVar3 = 0;
      if (bVar6) {
        pcVar1[lVar5] = '\0';
        return pcVar1;
      }
    }
    else {
      iVar3 = iVar3 + 1;
    }
  }
  next_log_token::rbuf[lVar5] = '\0';
  if (iVar3 == 0) {
    return (char *)0x0;
  }
  return pcVar1;
}

Assistant:

static char *next_log_token(void)
{
    static char *rbuf = NULL;
    static int rbuflen = 0;

    int rbpos = 0;
    long filepos = ftell(loginfo.flog);

    loginfo.last_token_start = filepos;
    while (1) {
	char c;
	if (rbpos >= rbuflen) {
	    rbuflen *= 2;
	    if (rbuflen < 256) rbuflen = 256;
	    rbuf = realloc(rbuf, rbuflen);
	}
	if (rbpos + filepos >= loginfo.endpos) {
	    rbuf[rbpos] = 0;
	    return rbpos ? rbuf : NULL;
	}
	if (fread(&c, 1, 1, loginfo.flog) != 1) {
	    raw_printf("Unexpected EOF or error in save file");
	    terminate();
	}
	rbuf[rbpos] = c;
	if (c == '\r' || c == '\n' || c == ' ') {
	    if (rbpos != 0) break;
	    /* otherwise overwrite the redundant whitespace the next time
	     * round the loop */
	} else {
	    rbpos++;
	}
    }
    rbuf[rbpos] = 0;
    return rbuf;
}